

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

int nondefp(sexp x)

{
  sexp_tag_t sVar1;
  sexp psVar2;
  int iVar3;
  anon_union_24768_35_b8e82fc1_for_value *paVar4;
  
  iVar3 = 0;
  if (((ulong)x & 3) == 0) {
    sVar1 = x->tag;
    if ((sVar1 != 6) && (sVar1 != 0x1d)) {
      if (sVar1 != 0x21) {
        return 0;
      }
      paVar4 = &x->value;
      do {
        psVar2 = (paVar4->type).name;
        if (((ulong)psVar2 & 3) != 0) {
          return 0;
        }
        if (psVar2->tag != 6) {
          return 0;
        }
        iVar3 = nondefp((psVar2->value).type.name);
        paVar4 = (anon_union_24768_35_b8e82fc1_for_value *)((long)&psVar2->value + 8);
      } while (iVar3 == 0);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int nondefp(sexp x) {
  sexp ls;
  if (sexp_pairp(x) || sexp_cndp(x))
    return 1;
  if (sexp_seqp(x))
    for (ls=sexp_seq_ls(x); sexp_pairp(ls); ls=sexp_cdr(ls))
      if (nondefp(sexp_car(ls)))
        return 1;
  return 0;
}